

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsEncoder.cpp
# Opt level: O3

void __thiscall Js::AsmJsEncoder::AddReloc(AsmJsEncoder *this,int labelOffset,BYTE *patchAddr)

{
  BYTE *pBVar1;
  EncoderRelocLabel *pEVar2;
  bool bVar3;
  EncoderReloc *pEVar4;
  undefined1 local_50 [8];
  int i;
  EncoderReloc *local_40;
  EncoderRelocLabel *local_38;
  EncoderRelocLabel *label;
  int labelOffset_local;
  
  local_38 = (EncoderRelocLabel *)0x0;
  label._4_4_ = labelOffset;
  bVar3 = JsUtil::
          BaseDictionary<int,_Js::AsmJsEncoder::EncoderRelocLabel,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::TryGetReference<int>
                    (this->mRelocLabelMap,(int *)((long)&label + 4),&local_38,(int *)local_50);
  pEVar2 = local_38;
  if (bVar3) {
    pBVar1 = this->mPc;
    pEVar4 = (EncoderReloc *)new<Memory::ArenaAllocator>(0x18,this->mLocalAlloc,0x364470);
    pEVar4->next = pEVar2->relocList;
    pEVar2->relocList = pEVar4;
    pEVar4->patchAddr = patchAddr;
    pEVar4->pc = pBVar1;
  }
  else {
    local_50[0] = 0;
    pBVar1 = this->mPc;
    local_40 = (EncoderReloc *)new<Memory::ArenaAllocator>(0x18,this->mLocalAlloc,0x364470);
    local_40->next = (EncoderReloc *)0x0;
    local_40->patchAddr = patchAddr;
    local_40->pc = pBVar1;
    JsUtil::
    BaseDictionary<int,Js::AsmJsEncoder::EncoderRelocLabel,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
    ::
    Insert<(JsUtil::BaseDictionary<int,Js::AsmJsEncoder::EncoderRelocLabel,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)1>
              ((BaseDictionary<int,Js::AsmJsEncoder::EncoderRelocLabel,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                *)this->mRelocLabelMap,(int *)((long)&label + 4),(EncoderRelocLabel *)local_50);
  }
  return;
}

Assistant:

void Js::AsmJsEncoder::AddReloc( const int labelOffset, BYTE* patchAddr )
    {
        EncoderRelocLabel* label = nullptr;
        if( mRelocLabelMap->TryGetReference( labelOffset, &label ) )
        {
            EncoderReloc::New( label, patchAddr, mPc, mLocalAlloc );
        }
        else
        {
            EncoderRelocLabel newLabel;
            EncoderReloc::New( &newLabel, patchAddr, mPc, mLocalAlloc );
            mRelocLabelMap->AddNew( labelOffset, newLabel );
        }
    }